

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_inherit_swap
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,Int prod_dim,LOs *keys2edges,
               LOs *keys2prods,LOs prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  pointer pcVar4;
  void *pvVar5;
  pointer pcVar6;
  Alloc *this;
  Alloc *pAVar7;
  Alloc *pAVar8;
  Alloc *pAVar9;
  Alloc *pAVar10;
  bool bVar11;
  Int IVar12;
  int iVar13;
  TagBase *tag;
  Tag<long> *this_00;
  Tag<signed_char> *this_01;
  Tag<int> *this_02;
  string *psVar14;
  Tag<double> *this_03;
  Int extraout_EDX;
  int i;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  Alloc *local_298;
  Read<signed_char> local_280;
  LOs local_270;
  LOs local_260;
  LOs local_250;
  LOs local_240;
  Read<signed_char> local_230;
  Read<signed_char> local_220;
  LOs local_210;
  Mesh *local_200;
  Read<signed_char> prod_data;
  Read<signed_char> key_data;
  Read<signed_char> edge_data;
  Alloc *local_1b8 [2];
  LOs *local_1a8;
  LOs *local_1a0;
  Mesh *local_198;
  LOs *local_190;
  Read<signed_char> *local_188;
  LOs *local_180;
  Alloc *local_178;
  pointer local_170;
  Alloc *local_168;
  void *local_160;
  Alloc *local_158;
  pointer local_150;
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  void *local_130;
  Alloc *local_128;
  pointer local_120;
  Alloc *local_118;
  void *local_110;
  Alloc *local_108;
  pointer local_100;
  Alloc *local_f8;
  void *local_f0;
  Alloc *local_e8;
  void *local_e0;
  Alloc *local_d8;
  pointer local_d0;
  Alloc *local_c8;
  void *local_c0;
  Alloc *local_b8;
  pointer local_b0;
  Alloc *local_a8;
  void *local_a0;
  Alloc *local_98;
  void *local_90;
  Alloc *local_88;
  pointer local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  pointer local_60;
  Alloc *local_58;
  void *local_50;
  Alloc *local_48;
  void *local_40;
  TransferOpts *local_38;
  
  local_198 = new_mesh;
  local_38 = opts;
  IVar12 = Mesh::ntags(old_mesh,prod_dim);
  if (0 < IVar12) {
    i = 0;
    local_180 = &local_210;
    local_188 = &local_230;
    local_190 = &local_240;
    local_200 = old_mesh;
    local_1a8 = keys2edges;
    local_1a0 = keys2prods;
    do {
      tag = Mesh::get_tag(old_mesh,prod_dim,i);
      bVar11 = should_inherit(old_mesh,local_38,extraout_EDX,tag);
      if (bVar11) {
        iVar13 = (*tag->_vptr_TagBase[2])(tag);
        switch(iVar13) {
        case 0:
          local_48 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_48 = (Alloc *)(local_48->size * 8 + 1);
            }
            else {
              local_48->use_count = local_48->use_count + 1;
            }
          }
          local_298 = local_48;
          pvVar2 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_58 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_58 = (Alloc *)(local_58->size * 8 + 1);
            }
            else {
              local_58->use_count = local_58->use_count + 1;
            }
          }
          this = local_58;
          pvVar3 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_68 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_68 = (Alloc *)(local_68->size * 8 + 1);
            }
            else {
              local_68->use_count = local_68->use_count + 1;
            }
          }
          pAVar10 = local_68;
          pcVar4 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_78 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_78 = (Alloc *)(local_78->size * 8 + 1);
            }
            else {
              local_78->use_count = local_78->use_count + 1;
            }
          }
          pAVar9 = local_78;
          pvVar5 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_88 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_88 = (Alloc *)(local_88->size * 8 + 1);
            }
            else {
              local_88->use_count = local_88->use_count + 1;
            }
          }
          pAVar8 = local_88;
          pcVar6 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_80 = pcVar6;
          local_70 = pvVar5;
          local_60 = pcVar4;
          local_50 = pvVar3;
          local_40 = pvVar2;
          psVar14 = TagBase::name_abi_cxx11_(tag);
          this_01 = Mesh::get_tag<signed_char>(local_200,1,psVar14);
          IVar12 = TagBase::ncomps(&this_01->super_TagBase);
          Tag<signed_char>::array(this_01);
          local_210.write_.shared_alloc_.alloc = local_298;
          bVar15 = ((ulong)local_298 & 7) == 0;
          bVar11 = bVar15 && local_298 != (Alloc *)0x0;
          if (bVar15 && local_298 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
            }
            else {
              local_298->use_count = local_298->use_count + 1;
            }
          }
          local_220.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = pvVar2;
          unmap<signed_char>((Omega_h *)local_1b8,&local_210,&local_220,IVar12);
          read<signed_char>((Omega_h *)&key_data,(Write<signed_char> *)local_1b8);
          pAVar7 = local_1b8[0];
          if (((ulong)local_1b8[0] & 7) == 0 && local_1b8[0] != (Alloc *)0x0) {
            piVar1 = &local_1b8[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b8[0]);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          local_230.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_240.write_.shared_alloc_.alloc = this;
          bVar15 = ((ulong)this & 7) == 0;
          if (bVar15 && this != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
            }
            else {
              this->use_count = this->use_count + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = pvVar3;
          expand<signed_char>((Omega_h *)&prod_data,&local_230,&local_240,IVar12);
          pAVar7 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_230.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          bVar16 = ((ulong)pAVar9 & 7) == 0;
          local_250.write_.shared_alloc_.alloc = pAVar9;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
            }
            else {
              pAVar9->use_count = pAVar9->use_count + 1;
            }
          }
          local_260.write_.shared_alloc_.alloc = pAVar8;
          bVar17 = ((ulong)pAVar8 & 7) == 0;
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc = (Alloc *)(pAVar8->size * 8 + 1);
            }
            else {
              pAVar8->use_count = pAVar8->use_count + 1;
            }
          }
          local_270.write_.shared_alloc_.alloc = pAVar10;
          bVar18 = ((ulong)pAVar10 & 7) == 0;
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
            }
            else {
              pAVar10->use_count = pAVar10->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          local_270.write_.shared_alloc_.direct_ptr = pcVar4;
          local_260.write_.shared_alloc_.direct_ptr = pcVar6;
          local_250.write_.shared_alloc_.direct_ptr = pvVar5;
          transfer_common<signed_char>
                    (local_200,local_198,prod_dim,&local_250,&local_260,&local_270,
                     &this_01->super_TagBase,&local_280);
          pAVar7 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              local_280.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_280.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_270.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            piVar1 = &pAVar8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar8);
              operator_delete(pAVar8,0x48);
            }
          }
          keys2prods = local_1a0;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
            }
          }
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
            }
          }
          keys2edges = local_1a8;
          if (bVar15 && this != (Alloc *)0x0) {
            piVar1 = &this->use_count;
            *piVar1 = *piVar1 + -1;
            iVar13 = *piVar1;
joined_r0x00402ab9:
            local_1a8 = keys2edges;
            if (iVar13 == 0) {
              Alloc::~Alloc(this);
              operator_delete(this,0x48);
            }
          }
          break;
        default:
          goto switchD_004008b6_caseD_1;
        case 2:
          local_98 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98 = (Alloc *)(local_98->size * 8 + 1);
            }
            else {
              local_98->use_count = local_98->use_count + 1;
            }
          }
          local_298 = local_98;
          pvVar2 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_a8 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a8 = (Alloc *)(local_a8->size * 8 + 1);
            }
            else {
              local_a8->use_count = local_a8->use_count + 1;
            }
          }
          this = local_a8;
          pvVar3 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_b8 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_b8 = (Alloc *)(local_b8->size * 8 + 1);
            }
            else {
              local_b8->use_count = local_b8->use_count + 1;
            }
          }
          pAVar10 = local_b8;
          pcVar4 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_c8 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_c8 = (Alloc *)(local_c8->size * 8 + 1);
            }
            else {
              local_c8->use_count = local_c8->use_count + 1;
            }
          }
          pAVar9 = local_c8;
          pvVar5 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_d8 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d8 = (Alloc *)(local_d8->size * 8 + 1);
            }
            else {
              local_d8->use_count = local_d8->use_count + 1;
            }
          }
          pAVar8 = local_d8;
          pcVar6 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_d0 = pcVar6;
          local_c0 = pvVar5;
          local_b0 = pcVar4;
          local_a0 = pvVar3;
          local_90 = pvVar2;
          psVar14 = TagBase::name_abi_cxx11_(tag);
          this_02 = Mesh::get_tag<int>(local_200,1,psVar14);
          IVar12 = TagBase::ncomps(&this_02->super_TagBase);
          Tag<int>::array(this_02);
          local_210.write_.shared_alloc_.alloc = local_298;
          bVar15 = ((ulong)local_298 & 7) == 0;
          bVar11 = bVar15 && local_298 != (Alloc *)0x0;
          if (bVar15 && local_298 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
            }
            else {
              local_298->use_count = local_298->use_count + 1;
            }
          }
          local_220.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = pvVar2;
          unmap<int>((Omega_h *)local_1b8,&local_210,(Read<int> *)&local_220,IVar12);
          read<int>((Omega_h *)&key_data,(Write<int> *)local_1b8);
          pAVar7 = local_1b8[0];
          if (((ulong)local_1b8[0] & 7) == 0 && local_1b8[0] != (Alloc *)0x0) {
            piVar1 = &local_1b8[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b8[0]);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          local_230.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_240.write_.shared_alloc_.alloc = this;
          bVar15 = ((ulong)this & 7) == 0;
          if (bVar15 && this != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
            }
            else {
              this->use_count = this->use_count + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = pvVar3;
          expand<int>((Omega_h *)&prod_data,(Read<int> *)&local_230,&local_240,IVar12);
          pAVar7 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_230.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          bVar16 = ((ulong)pAVar9 & 7) == 0;
          local_250.write_.shared_alloc_.alloc = pAVar9;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
            }
            else {
              pAVar9->use_count = pAVar9->use_count + 1;
            }
          }
          local_260.write_.shared_alloc_.alloc = pAVar8;
          bVar17 = ((ulong)pAVar8 & 7) == 0;
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc = (Alloc *)(pAVar8->size * 8 + 1);
            }
            else {
              pAVar8->use_count = pAVar8->use_count + 1;
            }
          }
          local_270.write_.shared_alloc_.alloc = pAVar10;
          bVar18 = ((ulong)pAVar10 & 7) == 0;
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
            }
            else {
              pAVar10->use_count = pAVar10->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          local_270.write_.shared_alloc_.direct_ptr = pcVar4;
          local_260.write_.shared_alloc_.direct_ptr = pcVar6;
          local_250.write_.shared_alloc_.direct_ptr = pvVar5;
          transfer_common<int>
                    (local_200,local_198,prod_dim,&local_250,&local_260,&local_270,
                     &this_02->super_TagBase,(Read<int> *)&local_280);
          pAVar7 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              local_280.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_280.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_270.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            piVar1 = &pAVar8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar8);
              operator_delete(pAVar8,0x48);
            }
          }
          keys2prods = local_1a0;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
            }
          }
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
            }
          }
          keys2edges = local_1a8;
          if (bVar15 && this != (Alloc *)0x0) {
            piVar1 = &this->use_count;
            *piVar1 = *piVar1 + -1;
            iVar13 = *piVar1;
            goto joined_r0x00402ab9;
          }
          break;
        case 3:
          local_e8 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_e8 = (Alloc *)(local_e8->size * 8 + 1);
            }
            else {
              local_e8->use_count = local_e8->use_count + 1;
            }
          }
          local_298 = local_e8;
          pvVar2 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_f8 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_f8 = (Alloc *)(local_f8->size * 8 + 1);
            }
            else {
              local_f8->use_count = local_f8->use_count + 1;
            }
          }
          this = local_f8;
          pvVar3 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_108 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_108 = (Alloc *)(local_108->size * 8 + 1);
            }
            else {
              local_108->use_count = local_108->use_count + 1;
            }
          }
          pAVar10 = local_108;
          pcVar4 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_118 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_118 = (Alloc *)(local_118->size * 8 + 1);
            }
            else {
              local_118->use_count = local_118->use_count + 1;
            }
          }
          pAVar9 = local_118;
          pvVar5 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_128 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_128 = (Alloc *)(local_128->size * 8 + 1);
            }
            else {
              local_128->use_count = local_128->use_count + 1;
            }
          }
          pAVar8 = local_128;
          pcVar6 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_120 = pcVar6;
          local_110 = pvVar5;
          local_100 = pcVar4;
          local_f0 = pvVar3;
          local_e0 = pvVar2;
          psVar14 = TagBase::name_abi_cxx11_(tag);
          this_00 = Mesh::get_tag<long>(local_200,1,psVar14);
          IVar12 = TagBase::ncomps(&this_00->super_TagBase);
          Tag<long>::array(this_00);
          local_210.write_.shared_alloc_.alloc = local_298;
          bVar15 = ((ulong)local_298 & 7) == 0;
          bVar11 = bVar15 && local_298 != (Alloc *)0x0;
          if (bVar15 && local_298 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
            }
            else {
              local_298->use_count = local_298->use_count + 1;
            }
          }
          local_220.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = pvVar2;
          unmap<long>((Omega_h *)local_1b8,&local_210,&local_220,IVar12);
          read<long>((Omega_h *)&key_data,(Write<signed_char> *)local_1b8);
          pAVar7 = local_1b8[0];
          if (((ulong)local_1b8[0] & 7) == 0 && local_1b8[0] != (Alloc *)0x0) {
            piVar1 = &local_1b8[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b8[0]);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          local_230.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_240.write_.shared_alloc_.alloc = this;
          bVar15 = ((ulong)this & 7) == 0;
          if (bVar15 && this != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
            }
            else {
              this->use_count = this->use_count + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = pvVar3;
          expand<long>((Omega_h *)&prod_data,&local_230,&local_240,IVar12);
          pAVar7 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_230.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          bVar16 = ((ulong)pAVar9 & 7) == 0;
          local_250.write_.shared_alloc_.alloc = pAVar9;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
            }
            else {
              pAVar9->use_count = pAVar9->use_count + 1;
            }
          }
          local_260.write_.shared_alloc_.alloc = pAVar8;
          bVar17 = ((ulong)pAVar8 & 7) == 0;
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc = (Alloc *)(pAVar8->size * 8 + 1);
            }
            else {
              pAVar8->use_count = pAVar8->use_count + 1;
            }
          }
          local_270.write_.shared_alloc_.alloc = pAVar10;
          bVar18 = ((ulong)pAVar10 & 7) == 0;
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
            }
            else {
              pAVar10->use_count = pAVar10->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          local_270.write_.shared_alloc_.direct_ptr = pcVar4;
          local_260.write_.shared_alloc_.direct_ptr = pcVar6;
          local_250.write_.shared_alloc_.direct_ptr = pvVar5;
          transfer_common<long>
                    (local_200,local_198,prod_dim,&local_250,&local_260,&local_270,
                     &this_00->super_TagBase,&local_280);
          pAVar7 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              local_280.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_280.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_270.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            piVar1 = &pAVar8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar8);
              operator_delete(pAVar8,0x48);
            }
          }
          keys2prods = local_1a0;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
            }
          }
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
            }
          }
          keys2edges = local_1a8;
          if (bVar15 && this != (Alloc *)0x0) {
            piVar1 = &this->use_count;
            *piVar1 = *piVar1 + -1;
            iVar13 = *piVar1;
            goto joined_r0x00402ab9;
          }
          break;
        case 5:
          local_138 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_138 = (Alloc *)(local_138->size * 8 + 1);
            }
            else {
              local_138->use_count = local_138->use_count + 1;
            }
          }
          local_298 = local_138;
          pvVar2 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_148 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_148 = (Alloc *)(local_148->size * 8 + 1);
            }
            else {
              local_148->use_count = local_148->use_count + 1;
            }
          }
          this = local_148;
          pvVar3 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_158 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_158 = (Alloc *)(local_158->size * 8 + 1);
            }
            else {
              local_158->use_count = local_158->use_count + 1;
            }
          }
          pAVar10 = local_158;
          pcVar4 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_168 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_168 = (Alloc *)(local_168->size * 8 + 1);
            }
            else {
              local_168->use_count = local_168->use_count + 1;
            }
          }
          pAVar9 = local_168;
          pvVar5 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_178 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_178 = (Alloc *)(local_178->size * 8 + 1);
            }
            else {
              local_178->use_count = local_178->use_count + 1;
            }
          }
          pAVar8 = local_178;
          pcVar6 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_170 = pcVar6;
          local_160 = pvVar5;
          local_150 = pcVar4;
          local_140 = pvVar3;
          local_130 = pvVar2;
          psVar14 = TagBase::name_abi_cxx11_(tag);
          this_03 = Mesh::get_tag<double>(local_200,1,psVar14);
          IVar12 = TagBase::ncomps(&this_03->super_TagBase);
          Tag<double>::array(this_03);
          local_210.write_.shared_alloc_.alloc = local_298;
          bVar15 = ((ulong)local_298 & 7) == 0;
          bVar11 = bVar15 && local_298 != (Alloc *)0x0;
          if (bVar15 && local_298 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
            }
            else {
              local_298->use_count = local_298->use_count + 1;
            }
          }
          local_220.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = pvVar2;
          unmap<double>((Omega_h *)local_1b8,&local_210,&local_220,IVar12);
          read<double>((Omega_h *)&key_data,(Write<signed_char> *)local_1b8);
          pAVar7 = local_1b8[0];
          if (((ulong)local_1b8[0] & 7) == 0 && local_1b8[0] != (Alloc *)0x0) {
            piVar1 = &local_1b8[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b8[0]);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          local_230.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_240.write_.shared_alloc_.alloc = this;
          bVar15 = ((ulong)this & 7) == 0;
          if (bVar15 && this != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
            }
            else {
              this->use_count = this->use_count + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = pvVar3;
          expand<double>((Omega_h *)&prod_data,&local_230,&local_240,IVar12);
          pAVar7 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              local_240.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_240.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_230.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          bVar16 = ((ulong)pAVar9 & 7) == 0;
          local_250.write_.shared_alloc_.alloc = pAVar9;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
            }
            else {
              pAVar9->use_count = pAVar9->use_count + 1;
            }
          }
          local_260.write_.shared_alloc_.alloc = pAVar8;
          bVar17 = ((ulong)pAVar8 & 7) == 0;
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc = (Alloc *)(pAVar8->size * 8 + 1);
            }
            else {
              pAVar8->use_count = pAVar8->use_count + 1;
            }
          }
          local_270.write_.shared_alloc_.alloc = pAVar10;
          bVar18 = ((ulong)pAVar10 & 7) == 0;
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
            }
            else {
              pAVar10->use_count = pAVar10->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          local_270.write_.shared_alloc_.direct_ptr = pcVar4;
          local_260.write_.shared_alloc_.direct_ptr = pcVar6;
          local_250.write_.shared_alloc_.direct_ptr = pvVar5;
          transfer_common<double>
                    (local_200,local_198,prod_dim,&local_250,&local_260,&local_270,
                     &this_03->super_TagBase,(Read<double> *)&local_280);
          pAVar7 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              local_280.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_280.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_270.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              local_250.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_250.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          pAVar7 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar7,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          if (bVar17 && pAVar8 != (Alloc *)0x0) {
            piVar1 = &pAVar8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar8);
              operator_delete(pAVar8,0x48);
            }
          }
          keys2prods = local_1a0;
          if (bVar16 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
            }
          }
          if (bVar18 && pAVar10 != (Alloc *)0x0) {
            piVar1 = &pAVar10->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar10);
              operator_delete(pAVar10,0x48);
            }
          }
          keys2edges = local_1a8;
          if (bVar15 && this != (Alloc *)0x0) {
            piVar1 = &this->use_count;
            *piVar1 = *piVar1 + -1;
            iVar13 = *piVar1;
            goto joined_r0x00402ab9;
          }
        }
        if (bVar11) {
          piVar1 = &local_298->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_298);
            operator_delete(local_298,0x48);
          }
        }
      }
switchD_004008b6_caseD_1:
      old_mesh = local_200;
      i = i + 1;
      IVar12 = Mesh::ntags(local_200,prod_dim);
    } while (i < IVar12);
  }
  return;
}

Assistant:

static void transfer_inherit_swap(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, Int prod_dim, LOs keys2edges, LOs keys2prods,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(prod_dim); ++i) {
    auto tagbase = old_mesh->get_tag(prod_dim, i);
    if (should_inherit(old_mesh, opts, prod_dim, tagbase)) {
      switch (tagbase->type()) {
        case OMEGA_H_I8:
          transfer_inherit_swap_tmpl<I8>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I32:
          transfer_inherit_swap_tmpl<I32>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I64:
          transfer_inherit_swap_tmpl<I64>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_F64:
          transfer_inherit_swap_tmpl<Real>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
      }
    }
  }
}